

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O2

char * irafgetc(char *irafheader,int offset,int nc)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  char cVar4;
  
  pcVar1 = (char *)calloc((ulong)(nc + 1),1);
  if (pcVar1 == (char *)0x0) {
    ffpmsg("IRAFGETC Cannot allocate memory for string variable");
  }
  else {
    uVar2 = 0;
    uVar3 = (ulong)(uint)nc;
    if (nc < 1) {
      uVar3 = uVar2;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      cVar4 = ' ';
      if (0x1e < (byte)(irafheader[uVar2 + (long)offset] - 1U)) {
        cVar4 = irafheader[uVar2 + (long)offset];
      }
      pcVar1[uVar2] = cVar4;
    }
  }
  return pcVar1;
}

Assistant:

static char *irafgetc (

char	*irafheader,	/* IRAF image header */
int	offset,		/* Number of bytes to skip before string */
int	nc)		/* Maximum number of characters in string */

{
    char *ctemp, *cheader;
    int i;

    cheader = irafheader;
    ctemp = (char *) calloc (nc+1, 1);
    if (ctemp == NULL) {
	ffpmsg("IRAFGETC Cannot allocate memory for string variable");
	return (NULL);
	}
    for (i = 0; i < nc; i++) {
	ctemp[i] = cheader[offset+i];
	if (ctemp[i] > 0 && ctemp[i] < 32)
	    ctemp[i] = ' ';
	}

    return (ctemp);
}